

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall vm::VM::Tprint<double>(VM *this)

{
  long lVar1;
  double_t dVar2;
  
  dVar2 = POP<double>(this);
  lVar1 = std::cout;
  *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(operator_delete__ + *(long *)(lVar1 + -0x18)) = 6;
  std::ostream::_M_insert<double>(dVar2);
  return;
}

Assistant:

void VM::Tprint() {
    auto value = POP<T>();
    if constexpr (std::is_floating_point_v<T>) {
        std::cout << std::fixed << std::setprecision(6) << value;
    }
    else if constexpr (std::is_integral_v<T>) {
        std::cout << value;
    }
}